

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O0

int module_unload(Server *server)

{
  Server *server_local;
  
  printf("Unloading module FileServer...\n");
  unload_file_from_mem();
  Server::remove_from_hook<HTTPResponse*(*)(Client*)>
            ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *)
             server,http_request_handler);
  printf("Unloaded module FileServer\n");
  return 0;
}

Assistant:

int module_unload(Server *server) {
    printf("Unloading module FileServer...\n");
    unload_file_from_mem();
    Server::remove_from_hook(server->http_request_hook, &http_request_handler);
    printf("Unloaded module FileServer\n");
    return 0;
}